

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int wally_psbt_extract(wally_psbt *psbt,wally_tx **output)

{
  wally_tx *tx;
  wally_psbt_input *pwVar1;
  uchar *src;
  wally_tx_witness_stack *stack;
  _Bool _Var2;
  int iVar3;
  wally_tx_input *pwVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  wally_tx *result;
  wally_tx *local_48;
  int local_3c;
  wally_tx_input *local_38;
  
  local_48 = (wally_tx *)0x0;
  iVar3 = -2;
  if (((((output != (wally_tx **)0x0) && (*output = (wally_tx *)0x0, psbt != (wally_psbt *)0x0)) &&
       (tx = psbt->tx, tx != (wally_tx *)0x0)) &&
      ((psbt->num_inputs != 0 && (psbt->num_outputs != 0)))) &&
     ((tx->num_inputs == psbt->num_inputs &&
      ((tx->num_outputs == psbt->num_outputs &&
       (iVar3 = wally_tx_clone_alloc(tx,0,&local_48), iVar3 == 0)))))) {
    iVar3 = 0;
    if (psbt->num_inputs != 0) {
      uVar6 = 0;
      lVar7 = 0x38;
      lVar5 = 0x40;
      do {
        pwVar1 = psbt->inputs;
        pwVar4 = local_48->inputs;
        src = *(uchar **)((long)pwVar1 + lVar5 + -0x10);
        if (src == (uchar *)0x0) {
          if (*(long *)((long)&pwVar1->utxo + lVar5) == 0) goto LAB_004b90ae;
LAB_004b909e:
          stack = *(wally_tx_witness_stack **)((long)&pwVar1->utxo + lVar5);
          if (stack == (wally_tx_witness_stack *)0x0) {
            bVar8 = true;
          }
          else {
            if (*(long *)(pwVar4->txhash + lVar7) != 0) goto LAB_004b90ae;
            iVar3 = wally_tx_witness_stack_clone_alloc
                              (stack,(wally_tx_witness_stack **)(pwVar4->txhash + lVar7));
            bVar8 = iVar3 == 0;
          }
        }
        else {
          if (*(long *)(pwVar4->txhash + lVar7 + -0x10) == 0) {
            local_3c = iVar3;
            local_38 = pwVar4;
            _Var2 = clone_bytes((uchar **)(pwVar4->txhash + lVar7 + -0x10),src,
                                *(size_t *)((long)pwVar1 + lVar5 + -8));
            if (_Var2) {
              *(undefined8 *)(local_38->txhash + lVar7 + -8) =
                   *(undefined8 *)((long)pwVar1 + lVar5 + -8);
              pwVar4 = local_38;
              iVar3 = local_3c;
              goto LAB_004b909e;
            }
            iVar3 = -3;
          }
          else {
LAB_004b90ae:
            iVar3 = -2;
          }
          bVar8 = false;
        }
        if (!bVar8) break;
        uVar6 = uVar6 + 1;
        lVar7 = lVar7 + 0xd0;
        lVar5 = lVar5 + 0x110;
      } while (uVar6 < psbt->num_inputs);
    }
    if (iVar3 == 0) {
      *output = local_48;
    }
    else {
      wally_tx_free(local_48);
    }
  }
  return iVar3;
}

Assistant:

int wally_psbt_extract(const struct wally_psbt *psbt, struct wally_tx **output)
{
    struct wally_tx *result = NULL;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;

    if (!psbt || !psbt->tx || !psbt->num_inputs || !psbt->num_outputs ||
        psbt->tx->num_inputs != psbt->num_inputs ||
        psbt->tx->num_outputs != psbt->num_outputs)
        return WALLY_EINVAL;

    if ((ret = tx_clone_alloc(psbt->tx, &result)) != WALLY_OK)
        return ret;

    for (i = 0; i < psbt->num_inputs; ++i) {
        const struct wally_psbt_input *input = &psbt->inputs[i];
        struct wally_tx_input *tx_input = &result->inputs[i];

        if (!input->final_scriptsig && !input->final_witness) {
            ret = WALLY_EINVAL;
            break;
        }

        if (input->final_scriptsig) {
            if (tx_input->script) {
                /* Our global tx shouldn't have a scriptSig */
                ret = WALLY_EINVAL;
                break;
            }
            if (!clone_bytes(&tx_input->script,
                             input->final_scriptsig,
                             input->final_scriptsig_len)) {
                ret = WALLY_ENOMEM;
                break;
            }
            tx_input->script_len = input->final_scriptsig_len;
        }
        if (input->final_witness) {
            if (tx_input->witness) {
                /* Our global tx shouldn't have a witness */
                ret = WALLY_EINVAL;
                break;
            }
            ret = wally_tx_witness_stack_clone_alloc(input->final_witness,
                                                     &tx_input->witness);
            if (ret != WALLY_OK)
                break;
        }
    }

    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_free(result);
    return ret;
}